

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cc
# Opt level: O2

t_pvalue __thiscall t_queue::f_pop(t_queue *this)

{
  long lVar1;
  long *plVar2;
  pthread_rwlock_t *__rwlock;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  long *in_RSI;
  t_pvalue tVar4;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar3;
  
  lVar1 = *in_RSI;
  plVar2 = (long *)__tls_get_addr(&PTR_00113e00);
  if (lVar1 == *plVar2) {
    tVar4 = f_pop::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this);
    aVar3 = tVar4.field_0;
  }
  else {
    if (lVar1 != 0) {
      xemmai::f_throw(0x18,L"owned by another thread.");
    }
    __rwlock = (pthread_rwlock_t *)
               xemmai::t_lock_with_safe_region<std::shared_mutex>::f_lock
                         ((shared_mutex *)(in_RSI + 1));
    if (*in_RSI != 0) {
      xemmai::f_throw(0x18,L"owned by another thread.");
    }
    f_pop::anon_class_8_1_8991fb9c::operator()((anon_class_8_1_8991fb9c *)this);
    pthread_rwlock_unlock(__rwlock);
    aVar3 = extraout_RDX;
  }
  tVar4.field_0.v_integer = aVar3.v_integer;
  tVar4.super_t_pointer.v_p = (t_object *)this;
  return tVar4;
}

Assistant:

t_pvalue t_queue::f_pop()
{
	return f_owned_or_shared<t_lock_with_safe_region>([&]
	{
		if (!v_head) f_throw(L"empty queue."sv);
		auto& pair = v_head->f_as<t_pair>().v_next;
		if (pair == v_head)
			v_head = nullptr;
		else
			v_head->f_as<t_pair>().v_next = pair->f_as<t_pair>().v_next;
		return t_pvalue(pair->f_as<t_pair>().v_value);
	});
}